

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

char * mctools_fileextension_view(mcu8str *path)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar1 = mctools_basename_view(path);
  pcVar3 = (char *)0x0;
  for (; (pcVar2 = pcVar1, *pcVar1 == '.' || (pcVar2 = pcVar3, *pcVar1 != '\0'));
      pcVar1 = pcVar1 + 1) {
    pcVar3 = pcVar2;
  }
  pcVar2 = pcVar3 + 1;
  if (pcVar3 == (char *)0x0) {
    pcVar2 = pcVar1;
  }
  return pcVar2;
}

Assistant:

const char* mctools_fileextension_view( const mcu8str* path )
  {
    const char * it = mctools_basename_view( path );
    const char * itLastDot = NULL;
    while ( 1 ) {
      if ( *it == 0 )
        break;//end of string reached
      if ( *it == '.' )
        itLastDot = it;
      ++it;
    }
    if ( itLastDot )
      return itLastDot + 1;
    return it;//empty string
  }